

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coeffarraydemo.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  int iVar1;
  FILE *__stream;
  FILE *__stream_00;
  int iVar2;
  bool bVar3;
  double a;
  Fir1 fir;
  
  Fir1::Fir1<50u>(&fir,&lp);
  printf("taps = %d\n",(ulong)fir.taps);
  __stream = fopen("ecg50hz.dat","rt");
  __stream_00 = fopen("ecg_filtered.dat","wt");
  iVar2 = 10000;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    iVar1 = __isoc99_fscanf(__stream,"%lf\n",&a);
    if (iVar1 < 1) break;
    a = Fir1::filter(&fir,a);
    fprintf(__stream_00,"%f\n");
  }
  fclose(__stream);
  fclose(__stream_00);
  fwrite("Written the filtered ECG to \'ecg_filtered.dat\'\n",0x2f,1,_stderr);
  Fir1::~Fir1(&fir);
  return 0;
}

Assistant:

int main (int,char**)
{
	// inits the filter
	Fir1 fir(lp);

	// gets the number of taps
	int taps = fir.getTaps();

	printf("taps = %d\n",taps);

	FILE *finput = fopen("ecg50hz.dat","rt");
	FILE *foutput = fopen("ecg_filtered.dat","wt");
	for(int i=0;i<10000;i++) 
	{
		double a;
		if (fscanf(finput,"%lf\n",&a)<1) break;
		a = fir.filter(a);
		fprintf(foutput,"%f\n",a);
	}
	fclose(finput);
	fclose(foutput);
	fprintf(stderr,"Written the filtered ECG to 'ecg_filtered.dat'\n");
}